

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::bad_function_call>_>::clone_impl
          (void *param_1,exception *param_2)

{
  error_info_injector<boost::bad_function_call> *in_stack_ffffffffffffffc8;
  exception *a;
  
  a = (exception *)param_1;
  clone_base::clone_base((clone_base *)((long)param_1 + 0x38));
  error_info_injector<boost::bad_function_call>::error_info_injector
            ((error_info_injector<boost::bad_function_call> *)param_1,in_stack_ffffffffffffffc8);
  *(undefined8 *)
   &((error_info_injector<boost::bad_function_call> *)param_1)->super_bad_function_call = 0x303e98;
  (((error_info_injector<boost::bad_function_call> *)param_1)->super_exception)._vptr_exception =
       (_func_int **)0x303ed0;
  *(undefined8 *)
   &((error_info_injector<boost::bad_function_call> *)((long)param_1 + 0x38))->
    super_bad_function_call = 0x303f08;
  copy_boost_exception(a,param_2);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }